

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints_with_arguments.cpp
# Opt level: O2

Am_Wrapper * __thiscall Object_Key_Store_Data::Make_Unique(Object_Key_Store_Data *this)

{
  Object_Key_Store_Data *this_00;
  
  this_00 = this;
  if ((this->super_Am_Wrapper).refs != 1) {
    Am_Wrapper::Release(&this->super_Am_Wrapper);
    this_00 = (Object_Key_Store_Data *)operator_new(0x20);
    Object_Key_Store_Data(this_00,this);
  }
  return &this_00->super_Am_Wrapper;
}

Assistant:

static Am_Value
from_object_procedure(Am_Object & /*self*/)
{
  Am_Value value;
  Object_Key_Store_Data *store =
      (Object_Key_Store_Data *)Am_Object_Advanced::Get_Context()->Get_Data();
  value = (store->object).Get(store->key);
  store->Release();
  return value;
}